

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  void **ppvVar1;
  _Bool connected;
  curl_chunk_end_callback p_Var2;
  Curl_easy *pCVar3;
  curl_chunk_bgn_callback p_Var4;
  CURLcode CVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 *puVar9;
  ftp_parselist_data *pfVar10;
  curl_wildcard_states cVar11;
  curl_wildcard_states cVar12;
  Curl_easy *pCVar13;
  CURLcode local_3c;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pCVar13 = conn->data;
  if ((pCVar13->set).wildcardmatch == true) {
    cVar12 = CURLWC_CLEAN;
    do {
      switch((pCVar13->wildcard).state) {
      case CURLWC_INIT:
        goto switchD_004dae5c_caseD_1;
      case CURLWC_MATCHING:
        puVar9 = (undefined8 *)(pCVar13->wildcard).tmp;
        (pCVar13->set).fwrite_func = (curl_write_callback)puVar9[1];
        (pCVar13->set).out = (void *)puVar9[2];
        puVar9[1] = 0;
        puVar9[2] = 0;
        (pCVar13->wildcard).state = CURLWC_DOWNLOADING;
        CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar9);
        cVar11 = cVar12;
        if (CVar5 != CURLE_OK) break;
        if ((pCVar13->wildcard).filelist.size != 0) goto LAB_004dafda;
        CVar5 = CURLE_REMOTE_FILE_NOT_FOUND;
        goto LAB_004db24c;
      case CURLWC_DOWNLOADING:
        puVar9 = (undefined8 *)((pCVar13->wildcard).filelist.head)->ptr;
        pcVar6 = curl_maprintf("%s%s",(pCVar13->wildcard).path,*puVar9);
        local_3c = CURLE_OUT_OF_MEMORY;
        if (pcVar6 == (char *)0x0) goto LAB_004db257;
        (*Curl_cfree)((conn->data->state).pathbuffer);
        pCVar3 = conn->data;
        (pCVar3->state).pathbuffer = pcVar6;
        (pCVar3->state).path = pcVar6;
        Curl_infof(pCVar3,"Wildcard - START of \"%s\"\n",*puVar9);
        p_Var4 = (conn->data->set).chunk_bgn;
        if (p_Var4 != (curl_chunk_bgn_callback)0x0) {
          lVar7 = (*p_Var4)(puVar9,(pCVar13->wildcard).customptr,
                            (int)(pCVar13->wildcard).filelist.size);
          if (lVar7 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar9);
            cVar11 = CURLWC_SKIP;
            break;
          }
          if (lVar7 == 1) {
            local_3c = CURLE_CHUNK_FAILED;
            goto LAB_004db257;
          }
        }
        cVar11 = CURLWC_SKIP;
        if (*(int *)(puVar9 + 1) == 0) {
          if ((*(byte *)(puVar9 + 0xc) & 0x40) != 0) {
            (conn->proto).ftpc.known_filesize = puVar9[5];
          }
          local_3c = ftp_parse_url_path(conn);
          if (local_3c != CURLE_OK) goto LAB_004db257;
          Curl_llist_remove(&(pCVar13->wildcard).filelist,(pCVar13->wildcard).filelist.head,
                            (void *)0x0);
          CVar5 = CURLE_OK;
          local_3c = CURLE_OK;
          if ((pCVar13->wildcard).filelist.size != 0) goto LAB_004db257;
          goto LAB_004db24c;
        }
        break;
      case CURLWC_CLEAN:
        puVar9 = (undefined8 *)(pCVar13->wildcard).tmp;
        if (puVar9 == (undefined8 *)0x0) {
          CVar5 = CURLE_OK;
          cVar12 = CURLWC_DONE;
        }
        else {
          CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar9);
          cVar12 = (CVar5 == CURLE_OK) + CURLWC_ERROR;
        }
        goto LAB_004db24c;
      case CURLWC_SKIP:
        p_Var2 = (pCVar13->set).chunk_end;
        if (p_Var2 != (curl_chunk_end_callback)0x0) {
          (*p_Var2)((pCVar13->wildcard).customptr);
        }
        Curl_llist_remove(&(pCVar13->wildcard).filelist,(pCVar13->wildcard).filelist.head,
                          (void *)0x0);
        cVar11 = ((pCVar13->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
        break;
      default:
        local_3c = CURLE_OK;
        goto LAB_004db257;
      }
      (pCVar13->wildcard).state = cVar11;
LAB_004dafda:
      pCVar13 = conn->data;
    } while( true );
  }
  CVar5 = ftp_parse_url_path(conn);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pCVar13 = conn->data;
  goto LAB_004db27b;
switchD_004dae5c_caseD_1:
  pcVar6 = (pCVar13->state).path;
  pcVar8 = strrchr(pcVar6,0x2f);
  if (pcVar8 != (char *)0x0) {
    if (pcVar8[1] != '\0') {
      pcVar6 = pcVar8 + 1;
      pcVar8 = (*Curl_cstrdup)(pcVar6);
      (pCVar13->wildcard).pattern = pcVar8;
      goto LAB_004db104;
    }
LAB_004db1b5:
    (pCVar13->wildcard).state = CURLWC_CLEAN;
    CVar5 = ftp_parse_url_path(conn);
    goto LAB_004db22d;
  }
  if (*pcVar6 == '\0') goto LAB_004db1b5;
  pcVar8 = (*Curl_cstrdup)(pcVar6);
  (pCVar13->wildcard).pattern = pcVar8;
LAB_004db104:
  if (pcVar8 == (char *)0x0) {
LAB_004db22a:
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *pcVar6 = '\0';
    puVar9 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    if (puVar9 == (undefined8 *)0x0) {
      (*Curl_cfree)((pCVar13->wildcard).pattern);
      (pCVar13->wildcard).pattern = (char *)0x0;
      goto LAB_004db22a;
    }
    pfVar10 = Curl_ftp_parselist_data_alloc();
    *puVar9 = pfVar10;
    if (pfVar10 == (ftp_parselist_data *)0x0) {
      (*Curl_cfree)((pCVar13->wildcard).pattern);
      (pCVar13->wildcard).pattern = (char *)0x0;
      (*Curl_cfree)(puVar9);
      goto LAB_004db22a;
    }
    (pCVar13->wildcard).tmp = puVar9;
    (pCVar13->wildcard).tmp_dtor = wc_data_dtor;
    if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
      (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
    }
    ppvVar1 = &(pCVar13->wildcard).tmp;
    CVar5 = ftp_parse_url_path(conn);
    if (CVar5 == CURLE_OK) {
      pcVar6 = (*Curl_cstrdup)((conn->data->state).path);
      (pCVar13->wildcard).path = pcVar6;
      if (pcVar6 == (char *)0x0) {
        (*Curl_cfree)((pCVar13->wildcard).pattern);
        (pCVar13->wildcard).pattern = (char *)0x0;
        (*(pCVar13->wildcard).tmp_dtor)((pCVar13->wildcard).tmp);
        *ppvVar1 = (void *)0x0;
        (pCVar13->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
        goto LAB_004db22a;
      }
      pCVar3 = conn->data;
      puVar9[1] = (pCVar3->set).fwrite_func;
      (pCVar3->set).fwrite_func = Curl_ftp_parselist;
      puVar9[2] = (pCVar3->set).out;
      (pCVar3->set).out = conn;
      Curl_infof(pCVar3,"Wildcard - Parsing started\n");
      CVar5 = CURLE_OK;
    }
    else {
      (*Curl_cfree)((pCVar13->wildcard).pattern);
      (pCVar13->wildcard).pattern = (char *)0x0;
      (*(pCVar13->wildcard).tmp_dtor)((pCVar13->wildcard).tmp);
      *ppvVar1 = (void *)0x0;
      (pCVar13->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
    }
  }
LAB_004db22d:
  local_3c = CVar5;
  if ((pCVar13->wildcard).state != CURLWC_CLEAN) {
    cVar12 = (uint)(CVar5 != CURLE_OK) * 4 + CURLWC_MATCHING;
LAB_004db24c:
    (pCVar13->wildcard).state = cVar12;
    local_3c = CVar5;
  }
LAB_004db257:
  pCVar13 = conn->data;
  if (((pCVar13->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (local_3c != CURLE_OK) {
    return local_3c;
  }
LAB_004db27b:
  (pCVar13->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar13,0);
  Curl_pgrsSetDownloadCounter(pCVar13,0);
  Curl_pgrsSetUploadSize(pCVar13,-1);
  Curl_pgrsSetDownloadSize(pCVar13,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x18) = 1;
  }
  *done = false;
  CVar5 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar5 == CURLE_OK) {
    CVar5 = ftp_multi_statemach(conn,done);
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar5 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar5 = ftp_dophase_done(conn,connected);
      return CVar5;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar5;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->set.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}